

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  Ref<embree::Geometry> *pRVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  undefined1 (*pauVar16) [16];
  undefined1 (*pauVar17) [16];
  ulong uVar18;
  ulong uVar19;
  ulong unaff_R12;
  size_t mask;
  ulong uVar20;
  ulong uVar21;
  undefined4 uVar22;
  ulong uVar23;
  Geometry *pGVar24;
  ulong uVar25;
  long lVar26;
  float fVar27;
  float fVar30;
  float fVar31;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar32;
  vint4 bi;
  undefined1 auVar33 [16];
  vint4 ai;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [16];
  undefined1 auVar54 [64];
  vint4 bi_1;
  undefined1 auVar55 [64];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  uint uVar59;
  uint uVar60;
  uint uVar61;
  undefined1 auVar58 [64];
  undefined1 auVar62 [16];
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  long local_1158;
  undefined1 local_10f8 [16];
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  undefined1 local_1098 [16];
  float local_1088 [4];
  float local_1078 [4];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined1 local_fb8 [16];
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  size_t local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  vbool<4> valid;
  vfloat<4> tNear;
  
  pauVar17 = (undefined1 (*) [16])local_f68;
  local_f78 = root.ptr;
  uStack_f70 = 0;
  fVar27 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_fc8._4_4_ = fVar27;
  local_fc8._0_4_ = fVar27;
  local_fc8._8_4_ = fVar27;
  local_fc8._12_4_ = fVar27;
  auVar49 = ZEXT1664(local_fc8);
  fVar30 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_fd8._4_4_ = fVar30;
  local_fd8._0_4_ = fVar30;
  local_fd8._8_4_ = fVar30;
  local_fd8._12_4_ = fVar30;
  auVar50 = ZEXT1664(local_fd8);
  fVar31 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_fe8._4_4_ = fVar31;
  local_fe8._0_4_ = fVar31;
  local_fe8._8_4_ = fVar31;
  local_fe8._12_4_ = fVar31;
  auVar51 = ZEXT1664(local_fe8);
  fVar27 = fVar27 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar30 = fVar30 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar31 = fVar31 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  uVar14 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar19 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  local_fb8._8_4_ = 0x80000000;
  local_fb8._0_8_ = 0x8000000080000000;
  local_fb8._12_4_ = 0x80000000;
  iVar13 = (tray->tfar).field_0.i[k];
  auVar55 = ZEXT1664(CONCAT412(iVar13,CONCAT48(iVar13,CONCAT44(iVar13,iVar13))));
  local_ff8._0_8_ = CONCAT44(fVar27,fVar27) ^ 0x8000000080000000;
  local_ff8._8_4_ = -fVar27;
  local_ff8._12_4_ = -fVar27;
  auVar52 = ZEXT1664(local_ff8);
  local_1008._0_8_ = CONCAT44(fVar30,fVar30) ^ 0x8000000080000000;
  local_1008._8_4_ = -fVar30;
  local_1008._12_4_ = -fVar30;
  auVar54 = ZEXT1664(local_1008);
  local_1018._0_8_ = CONCAT44(fVar31,fVar31) ^ 0x8000000080000000;
  local_1018._8_4_ = -fVar31;
  local_1018._12_4_ = -fVar31;
  auVar57 = ZEXT1664(local_1018);
  iVar13 = (tray->tnear).field_0.i[k];
  local_1028._4_4_ = iVar13;
  local_1028._0_4_ = iVar13;
  local_1028._8_4_ = iVar13;
  local_1028._12_4_ = iVar13;
  auVar58 = ZEXT1664(local_1028);
  do {
    do {
      do {
        if (pauVar17 == (undefined1 (*) [16])&local_f78) {
          return;
        }
        pauVar16 = pauVar17 + -1;
        pauVar17 = pauVar17 + -1;
      } while (*(float *)(ray + k * 4 + 0x100) < *(float *)(*pauVar16 + 8));
      uVar21 = *(ulong *)*pauVar17;
      pauVar16 = pauVar17;
      do {
        if ((uVar21 & 8) == 0) {
          auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar14),auVar52._0_16_,
                                    auVar49._0_16_);
          auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar18),auVar54._0_16_,
                                    auVar50._0_16_);
          auVar28 = vpmaxsd_avx(auVar28,auVar33);
          auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + uVar19),auVar57._0_16_,
                                    auVar51._0_16_);
          auVar33 = vpmaxsd_avx(auVar33,auVar58._0_16_);
          local_10e8 = vpmaxsd_avx(auVar28,auVar33);
          auVar28 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar14 ^ 0x10)),
                                    auVar52._0_16_,auVar49._0_16_);
          auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar18 ^ 0x10)),
                                    auVar54._0_16_,auVar50._0_16_);
          auVar28 = vpminsd_avx(auVar28,auVar33);
          auVar33 = vfmadd132ps_fma(*(undefined1 (*) [16])(uVar21 + 0x20 + (uVar19 ^ 0x10)),
                                    auVar57._0_16_,auVar51._0_16_);
          auVar33 = vpminsd_avx(auVar33,auVar55._0_16_);
          auVar28 = vpminsd_avx(auVar28,auVar33);
          auVar28 = vpcmpgtd_avx(local_10e8,auVar28);
          uVar12 = vmovmskps_avx(auVar28);
          unaff_R12 = ((ulong)uVar12 ^ 0xf) & 0xff;
        }
        pauVar17 = pauVar16;
        if ((uVar21 & 8) == 0) {
          if (unaff_R12 == 0) {
            iVar13 = 4;
          }
          else {
            uVar20 = uVar21 & 0xfffffffffffffff0;
            lVar15 = 0;
            for (uVar21 = unaff_R12; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
              lVar15 = lVar15 + 1;
            }
            iVar13 = 0;
            uVar23 = unaff_R12 - 1 & unaff_R12;
            uVar21 = *(ulong *)(uVar20 + lVar15 * 8);
            if (uVar23 != 0) {
              uVar12 = *(uint *)(local_10e8 + lVar15 * 4);
              lVar15 = 0;
              for (uVar25 = uVar23; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
                lVar15 = lVar15 + 1;
              }
              uVar23 = uVar23 - 1 & uVar23;
              uVar25 = *(ulong *)(uVar20 + lVar15 * 8);
              uVar59 = *(uint *)(local_10e8 + lVar15 * 4);
              if (uVar23 == 0) {
                pauVar17 = pauVar16 + 1;
                if (uVar12 < uVar59) {
                  *(ulong *)*pauVar16 = uVar25;
                  *(uint *)(*pauVar16 + 8) = uVar59;
                }
                else {
                  *(ulong *)*pauVar16 = uVar21;
                  *(uint *)(*pauVar16 + 8) = uVar12;
                  uVar21 = uVar25;
                }
              }
              else {
                auVar28._8_8_ = 0;
                auVar28._0_8_ = uVar21;
                auVar28 = vpunpcklqdq_avx(auVar28,ZEXT416(uVar12));
                auVar33._8_8_ = 0;
                auVar33._0_8_ = uVar25;
                auVar33 = vpunpcklqdq_avx(auVar33,ZEXT416(uVar59));
                lVar15 = 0;
                for (uVar21 = uVar23; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000)
                {
                  lVar15 = lVar15 + 1;
                }
                uVar23 = uVar23 - 1 & uVar23;
                auVar34._8_8_ = 0;
                auVar34._0_8_ = *(ulong *)(uVar20 + lVar15 * 8);
                auVar29 = vpunpcklqdq_avx(auVar34,ZEXT416(*(uint *)(local_10e8 + lVar15 * 4)));
                auVar34 = vpcmpgtd_avx(auVar33,auVar28);
                iVar13 = 0;
                if (uVar23 == 0) {
                  auVar39 = vpshufd_avx(auVar34,0xaa);
                  auVar34 = vblendvps_avx(auVar33,auVar28,auVar39);
                  auVar28 = vblendvps_avx(auVar28,auVar33,auVar39);
                  auVar33 = vpcmpgtd_avx(auVar29,auVar34);
                  auVar39 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar29,auVar34,auVar39);
                  auVar34 = vblendvps_avx(auVar34,auVar29,auVar39);
                  auVar29 = vpcmpgtd_avx(auVar34,auVar28);
                  auVar39 = vpshufd_avx(auVar29,0xaa);
                  auVar29 = vblendvps_avx(auVar34,auVar28,auVar39);
                  auVar28 = vblendvps_avx(auVar28,auVar34,auVar39);
                  *pauVar16 = auVar28;
                  pauVar16[1] = auVar29;
                  uVar21 = auVar33._0_8_;
                  pauVar17 = pauVar16 + 2;
                }
                else {
                  lVar15 = 0;
                  for (; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                    lVar15 = lVar15 + 1;
                  }
                  auVar39._8_8_ = 0;
                  auVar39._0_8_ = *(ulong *)(uVar20 + lVar15 * 8);
                  auVar5 = vpunpcklqdq_avx(auVar39,ZEXT416(*(uint *)(local_10e8 + lVar15 * 4)));
                  auVar39 = vpshufd_avx(auVar34,0xaa);
                  auVar34 = vblendvps_avx(auVar33,auVar28,auVar39);
                  auVar28 = vblendvps_avx(auVar28,auVar33,auVar39);
                  auVar33 = vpcmpgtd_avx(auVar5,auVar29);
                  auVar39 = vpshufd_avx(auVar33,0xaa);
                  auVar33 = vblendvps_avx(auVar5,auVar29,auVar39);
                  auVar29 = vblendvps_avx(auVar29,auVar5,auVar39);
                  auVar39 = vpcmpgtd_avx(auVar29,auVar28);
                  auVar5 = vpshufd_avx(auVar39,0xaa);
                  auVar39 = vblendvps_avx(auVar29,auVar28,auVar5);
                  auVar28 = vblendvps_avx(auVar28,auVar29,auVar5);
                  auVar29 = vpcmpgtd_avx(auVar33,auVar34);
                  auVar5 = vpshufd_avx(auVar29,0xaa);
                  auVar29 = vblendvps_avx(auVar33,auVar34,auVar5);
                  auVar33 = vblendvps_avx(auVar34,auVar33,auVar5);
                  auVar34 = vpcmpgtd_avx(auVar39,auVar33);
                  auVar5 = vpshufd_avx(auVar34,0xaa);
                  auVar34 = vblendvps_avx(auVar39,auVar33,auVar5);
                  auVar33 = vblendvps_avx(auVar33,auVar39,auVar5);
                  *pauVar16 = auVar28;
                  pauVar16[1] = auVar33;
                  pauVar16[2] = auVar34;
                  uVar21 = auVar29._0_8_;
                  pauVar17 = pauVar16 + 3;
                }
              }
            }
          }
        }
        else {
          iVar13 = 6;
        }
        pauVar16 = pauVar17;
      } while (iVar13 == 0);
    } while (iVar13 != 6);
    uVar20 = (ulong)((uint)uVar21 & 0xf);
    if (uVar20 != 8) {
      uVar21 = uVar21 & 0xfffffffffffffff0;
      uVar1 = *(undefined4 *)(ray + k * 4);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      uVar3 = *(undefined4 *)(ray + k * 4 + 0x40);
      local_f88 = *(float *)(ray + k * 4 + 0x80);
      fStack_f84 = local_f88;
      fStack_f80 = local_f88;
      fStack_f7c = local_f88;
      local_f98 = *(float *)(ray + k * 4 + 0xa0);
      fStack_f94 = local_f98;
      fStack_f90 = local_f98;
      fStack_f8c = local_f98;
      local_fa8 = *(float *)(ray + k * 4 + 0xc0);
      fStack_fa4 = local_fa8;
      fStack_fa0 = local_fa8;
      fStack_f9c = local_fa8;
      lVar15 = 0;
      do {
        lVar26 = lVar15 * 0xb0;
        auVar28 = *(undefined1 (*) [16])(uVar21 + 0x80 + lVar26);
        auVar33 = *(undefined1 (*) [16])(uVar21 + 0x40 + lVar26);
        auVar34 = *(undefined1 (*) [16])(uVar21 + 0x70 + lVar26);
        auVar29 = *(undefined1 (*) [16])(uVar21 + 0x50 + lVar26);
        auVar53._0_4_ = auVar33._0_4_ * auVar28._0_4_;
        auVar53._4_4_ = auVar33._4_4_ * auVar28._4_4_;
        auVar53._8_4_ = auVar33._8_4_ * auVar28._8_4_;
        auVar53._12_4_ = auVar33._12_4_ * auVar28._12_4_;
        local_1058 = vfmsub231ps_fma(auVar53,auVar34,auVar29);
        auVar39 = *(undefined1 (*) [16])(uVar21 + 0x60 + lVar26);
        auVar5._4_4_ = uVar1;
        auVar5._0_4_ = uVar1;
        auVar5._8_4_ = uVar1;
        auVar5._12_4_ = uVar1;
        auVar53 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + lVar26),auVar5);
        auVar7._4_4_ = uVar2;
        auVar7._0_4_ = uVar2;
        auVar7._8_4_ = uVar2;
        auVar7._12_4_ = uVar2;
        auVar7 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x10 + lVar26),auVar7);
        auVar8._4_4_ = uVar3;
        auVar8._0_4_ = uVar3;
        auVar8._8_4_ = uVar3;
        auVar8._12_4_ = uVar3;
        auVar8 = vsubps_avx(*(undefined1 (*) [16])(uVar21 + 0x20 + lVar26),auVar8);
        auVar5 = *(undefined1 (*) [16])(uVar21 + 0x30 + lVar26);
        auVar36._0_4_ = auVar29._0_4_ * auVar39._0_4_;
        auVar36._4_4_ = auVar29._4_4_ * auVar39._4_4_;
        auVar36._8_4_ = auVar29._8_4_ * auVar39._8_4_;
        auVar36._12_4_ = auVar29._12_4_ * auVar39._12_4_;
        local_1048 = vfmsub231ps_fma(auVar36,auVar28,auVar5);
        auVar11._4_4_ = fStack_f84;
        auVar11._0_4_ = local_f88;
        auVar11._8_4_ = fStack_f80;
        auVar11._12_4_ = fStack_f7c;
        auVar41._0_4_ = local_f88 * auVar7._0_4_;
        auVar41._4_4_ = fStack_f84 * auVar7._4_4_;
        auVar41._8_4_ = fStack_f80 * auVar7._8_4_;
        auVar41._12_4_ = fStack_f7c * auVar7._12_4_;
        auVar10._4_4_ = fStack_f94;
        auVar10._0_4_ = local_f98;
        auVar10._8_4_ = fStack_f90;
        auVar10._12_4_ = fStack_f8c;
        auVar9 = vfmsub231ps_fma(auVar41,auVar53,auVar10);
        auVar40._0_4_ = auVar28._0_4_ * auVar9._0_4_;
        auVar40._4_4_ = auVar28._4_4_ * auVar9._4_4_;
        auVar40._8_4_ = auVar28._8_4_ * auVar9._8_4_;
        auVar40._12_4_ = auVar28._12_4_ * auVar9._12_4_;
        auVar42._0_4_ = auVar29._0_4_ * auVar9._0_4_;
        auVar42._4_4_ = auVar29._4_4_ * auVar9._4_4_;
        auVar42._8_4_ = auVar29._8_4_ * auVar9._8_4_;
        auVar42._12_4_ = auVar29._12_4_ * auVar9._12_4_;
        auVar9._4_4_ = fStack_fa4;
        auVar9._0_4_ = local_fa8;
        auVar9._8_4_ = fStack_fa0;
        auVar9._12_4_ = fStack_f9c;
        auVar35._0_4_ = local_fa8 * auVar53._0_4_;
        auVar35._4_4_ = fStack_fa4 * auVar53._4_4_;
        auVar35._8_4_ = fStack_fa0 * auVar53._8_4_;
        auVar35._12_4_ = fStack_f9c * auVar53._12_4_;
        auVar29 = vfmsub231ps_fma(auVar35,auVar8,auVar11);
        auVar28 = vfmadd231ps_fma(auVar40,auVar29,auVar34);
        auVar56._0_4_ = auVar34._0_4_ * auVar5._0_4_;
        auVar56._4_4_ = auVar34._4_4_ * auVar5._4_4_;
        auVar56._8_4_ = auVar34._8_4_ * auVar5._8_4_;
        auVar56._12_4_ = auVar34._12_4_ * auVar5._12_4_;
        local_1038 = vfmsub231ps_fma(auVar56,auVar39,auVar33);
        auVar33 = vfmadd231ps_fma(auVar42,auVar33,auVar29);
        auVar47._0_4_ = local_f98 * auVar8._0_4_;
        auVar47._4_4_ = fStack_f94 * auVar8._4_4_;
        auVar47._8_4_ = fStack_f90 * auVar8._8_4_;
        auVar47._12_4_ = fStack_f8c * auVar8._12_4_;
        auVar9 = vfmsub231ps_fma(auVar47,auVar7,auVar9);
        auVar62._0_4_ = local_1038._0_4_ * local_fa8;
        auVar62._4_4_ = local_1038._4_4_ * fStack_fa4;
        auVar62._8_4_ = local_1038._8_4_ * fStack_fa0;
        auVar62._12_4_ = local_1038._12_4_ * fStack_f9c;
        auVar34 = vfmadd231ps_fma(auVar62,local_1048,auVar10);
        auVar34 = vfmadd231ps_fma(auVar34,local_1058,auVar11);
        auVar29 = vfmadd231ps_fma(auVar28,auVar9,auVar39);
        auVar28 = vandps_avx(auVar34,local_fb8);
        uVar12 = auVar28._0_4_;
        local_10e8._0_4_ = (float)(uVar12 ^ auVar29._0_4_);
        uVar59 = auVar28._4_4_;
        local_10e8._4_4_ = (float)(uVar59 ^ auVar29._4_4_);
        uVar60 = auVar28._8_4_;
        local_10e8._8_4_ = (float)(uVar60 ^ auVar29._8_4_);
        uVar61 = auVar28._12_4_;
        local_10e8._12_4_ = (float)(uVar61 ^ auVar29._12_4_);
        auVar28 = vfmadd231ps_fma(auVar33,auVar5,auVar9);
        local_10d8._0_4_ = (float)(uVar12 ^ auVar28._0_4_);
        local_10d8._4_4_ = (float)(uVar59 ^ auVar28._4_4_);
        local_10d8._8_4_ = (float)(uVar60 ^ auVar28._8_4_);
        local_10d8._12_4_ = (float)(uVar61 ^ auVar28._12_4_);
        auVar39 = ZEXT816(0) << 0x20;
        auVar28 = vcmpps_avx(local_10e8,auVar39,5);
        auVar33 = vcmpps_avx(local_10d8,auVar39,5);
        auVar28 = vandps_avx(auVar28,auVar33);
        auVar29._8_4_ = 0x7fffffff;
        auVar29._0_8_ = 0x7fffffff7fffffff;
        auVar29._12_4_ = 0x7fffffff;
        local_10b8 = vandps_avx(auVar34,auVar29);
        auVar33 = vcmpps_avx(auVar34,auVar39,4);
        auVar28 = vandps_avx(auVar28,auVar33);
        auVar43._0_4_ = local_10e8._0_4_ + local_10d8._0_4_;
        auVar43._4_4_ = local_10e8._4_4_ + local_10d8._4_4_;
        auVar43._8_4_ = local_10e8._8_4_ + local_10d8._8_4_;
        auVar43._12_4_ = local_10e8._12_4_ + local_10d8._12_4_;
        auVar33 = vcmpps_avx(auVar43,local_10b8,2);
        auVar34 = auVar33 & auVar28;
        if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar34[0xf] < '\0') {
          auVar28 = vandps_avx(auVar28,auVar33);
          auVar44._0_4_ = local_1038._0_4_ * auVar8._0_4_;
          auVar44._4_4_ = local_1038._4_4_ * auVar8._4_4_;
          auVar44._8_4_ = local_1038._8_4_ * auVar8._8_4_;
          auVar44._12_4_ = local_1038._12_4_ * auVar8._12_4_;
          auVar33 = vfmadd213ps_fma(auVar7,local_1048,auVar44);
          auVar33 = vfmadd213ps_fma(auVar53,local_1058,auVar33);
          local_10c8._0_4_ = (float)(uVar12 ^ auVar33._0_4_);
          local_10c8._4_4_ = (float)(uVar59 ^ auVar33._4_4_);
          local_10c8._8_4_ = (float)(uVar60 ^ auVar33._8_4_);
          local_10c8._12_4_ = (float)(uVar61 ^ auVar33._12_4_);
          fVar27 = *(float *)(ray + k * 4 + 0x60);
          auVar45._0_4_ = local_10b8._0_4_ * fVar27;
          auVar45._4_4_ = local_10b8._4_4_ * fVar27;
          auVar45._8_4_ = local_10b8._8_4_ * fVar27;
          auVar45._12_4_ = local_10b8._12_4_ * fVar27;
          auVar33 = vcmpps_avx(auVar45,local_10c8,1);
          fVar27 = *(float *)(ray + k * 4 + 0x100);
          auVar48._0_4_ = local_10b8._0_4_ * fVar27;
          auVar48._4_4_ = local_10b8._4_4_ * fVar27;
          auVar48._8_4_ = local_10b8._8_4_ * fVar27;
          auVar48._12_4_ = local_10b8._12_4_ * fVar27;
          auVar34 = vcmpps_avx(local_10c8,auVar48,2);
          auVar33 = vandps_avx(auVar33,auVar34);
          auVar34 = auVar28 & auVar33;
          if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar34[0xf] < '\0') {
            local_10f8 = vandps_avx(auVar33,auVar28);
            local_1098 = local_10f8;
            auVar28 = vrcpps_avx(local_10b8);
            auVar37._8_4_ = 0x3f800000;
            auVar37._0_8_ = &DAT_3f8000003f800000;
            auVar37._12_4_ = 0x3f800000;
            auVar33 = vfnmadd213ps_fma(local_10b8,auVar28,auVar37);
            auVar28 = vfmadd132ps_fma(auVar33,auVar28,auVar28);
            fVar27 = auVar28._0_4_;
            auVar38._0_4_ = fVar27 * local_10c8._0_4_;
            fVar30 = auVar28._4_4_;
            auVar38._4_4_ = fVar30 * local_10c8._4_4_;
            fVar31 = auVar28._8_4_;
            auVar38._8_4_ = fVar31 * local_10c8._8_4_;
            fVar32 = auVar28._12_4_;
            auVar38._12_4_ = fVar32 * local_10c8._12_4_;
            local_1068 = auVar38;
            local_1088[0] = fVar27 * local_10e8._0_4_;
            local_1088[1] = fVar30 * local_10e8._4_4_;
            local_1088[2] = fVar31 * local_10e8._8_4_;
            local_1088[3] = fVar32 * local_10e8._12_4_;
            auVar46._8_4_ = 0x7f800000;
            auVar46._0_8_ = 0x7f8000007f800000;
            auVar46._12_4_ = 0x7f800000;
            auVar28 = vblendvps_avx(auVar46,auVar38,local_10f8);
            local_1078[0] = fVar27 * local_10d8._0_4_;
            local_1078[1] = fVar30 * local_10d8._4_4_;
            local_1078[2] = fVar31 * local_10d8._8_4_;
            local_1078[3] = fVar32 * local_10d8._12_4_;
            auVar33 = vshufps_avx(auVar28,auVar28,0xb1);
            auVar33 = vminps_avx(auVar33,auVar28);
            auVar34 = vshufpd_avx(auVar33,auVar33,1);
            auVar33 = vminps_avx(auVar34,auVar33);
            auVar28 = vcmpps_avx(auVar28,auVar33,0);
            auVar34 = local_10f8 & auVar28;
            auVar33 = vpcmpeqd_avx(auVar33,auVar33);
            if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar34[0xf] < '\0') {
              auVar33 = auVar28;
            }
            lVar26 = lVar26 + uVar21;
            auVar28 = vandps_avx(local_10f8,auVar33);
            uVar22 = vmovmskps_avx(auVar28);
            local_1158 = 0;
            for (uVar23 = CONCAT44((int)((ulong)context >> 0x20),uVar22); (uVar23 & 1) == 0;
                uVar23 = uVar23 >> 1 | 0x8000000000000000) {
              local_1158 = local_1158 + 1;
            }
            pRVar6 = (context->scene->geometries).items;
            uVar12 = *(uint *)(ray + k * 4 + 0x120);
            uVar23 = (ulong)*(uint *)(lVar26 + 0x90 + local_1158 * 4);
            pGVar24 = pRVar6[uVar23].ptr;
            while ((pGVar24->mask & uVar12) == 0) {
              *(undefined4 *)(local_10f8 + local_1158 * 4) = 0;
              if ((((local_10f8 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (local_10f8 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (local_10f8 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < local_10f8[0xf]) goto LAB_005d2990;
              auVar28 = vblendvps_avx(auVar46,auVar38,local_10f8);
              auVar33 = vshufps_avx(auVar28,auVar28,0xb1);
              auVar33 = vminps_avx(auVar33,auVar28);
              auVar34 = vshufpd_avx(auVar33,auVar33,1);
              auVar33 = vminps_avx(auVar34,auVar33);
              auVar33 = vcmpps_avx(auVar28,auVar33,0);
              auVar34 = local_10f8 & auVar33;
              auVar28 = local_10f8;
              if ((((auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar34[0xf] < '\0') {
                auVar28 = vandps_avx(auVar33,local_10f8);
              }
              uVar23 = (ulong)local_1158 >> 0x20;
              uVar22 = vmovmskps_avx(auVar28);
              local_1158 = 0;
              for (uVar23 = CONCAT44((int)uVar23,uVar22); (uVar23 & 1) == 0;
                  uVar23 = uVar23 >> 1 | 0x8000000000000000) {
                local_1158 = local_1158 + 1;
              }
              uVar23 = (ulong)*(uint *)(lVar26 + 0x90 + local_1158 * 4);
              pGVar24 = pRVar6[uVar23].ptr;
            }
            uVar25 = (ulong)(uint)((int)local_1158 << 2);
            uVar22 = *(undefined4 *)((long)local_1088 + uVar25);
            uVar4 = *(undefined4 *)((long)local_1078 + uVar25);
            *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1068 + uVar25);
            *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1058 + uVar25);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1048 + uVar25);
            *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_1038 + uVar25);
            *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar22;
            *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
            *(undefined4 *)(ray + k * 4 + 0x220) = *(undefined4 *)(lVar26 + 0xa0 + uVar25);
            *(int *)(ray + k * 4 + 0x240) = (int)uVar23;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
          }
        }
LAB_005d2990:
        lVar15 = lVar15 + 1;
      } while (lVar15 != uVar20 - 8);
    }
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar55 = ZEXT1664(CONCAT412(uVar1,CONCAT48(uVar1,CONCAT44(uVar1,uVar1))));
    auVar49 = ZEXT1664(local_fc8);
    auVar50 = ZEXT1664(local_fd8);
    auVar51 = ZEXT1664(local_fe8);
    auVar52 = ZEXT1664(local_ff8);
    auVar54 = ZEXT1664(local_1008);
    auVar57 = ZEXT1664(local_1018);
    auVar58 = ZEXT1664(local_1028);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }